

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Decode
          (Linear_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  undefined1 *V;
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  byte bVar3;
  allocator<char> local_91;
  LinearSegmentParameter local_90;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
    ::clear(&this->m_vSegments);
    Object_State_Header::Decode(&this->super_Object_State_Header,stream,ignoreHeader);
    V = &(this->super_Object_State_Header).field_0x4b;
    KDataStream::Read(stream,V);
    (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ReqID,stream);
    (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecvID,stream);
    (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ObjTyp,stream);
    for (bVar3 = 0; bVar3 < (byte)*V; bVar3 = bVar3 + 1) {
      DATA_TYPE::LinearSegmentParameter::LinearSegmentParameter(&local_90,stream);
      std::
      vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
      ::emplace_back<KDIS::DATA_TYPE::LinearSegmentParameter>(&this->m_vSegments,&local_90);
      DATA_TYPE::LinearSegmentParameter::~LinearSegmentParameter(&local_90);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Decode",&local_91);
  KException::KException(this_00,(KString *)&local_90,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Linear_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LINEAR_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSegments.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumSegment
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID
           >> KDIS_STREAM m_ObjTyp;

    for( KUINT8 i = 0; i < m_ui8NumSegment; ++i )
    {
        m_vSegments.push_back( LinearSegmentParameter( stream ) );
    }
}